

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsearch.c
# Opt level: O3

int main(void)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  pcVar1 = "abcde";
  uVar4 = 4;
  do {
    uVar3 = uVar4 >> 1;
    if ((byte)pcVar1[uVar3] < 0x65) {
      pcVar1 = pcVar1 + uVar3 + 1;
      uVar3 = uVar3 - (~(uint)uVar4 & 1);
    }
    else if (pcVar1[uVar3] == 0x65) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
             ,0x35,"bsearch( \"e\", abcde, 4, 1, compare ) == NULL");
      break;
    }
    uVar4 = uVar3;
  } while (uVar3 != 0);
  lVar5 = 0;
  pcVar1 = "abcde";
  uVar4 = 5;
  do {
    uVar3 = uVar4 >> 1;
    lVar6 = uVar3 + lVar5;
    if ((byte)"abcde"[lVar6] < 0x65) {
      lVar5 = lVar6 + 1;
      uVar3 = uVar3 - (~(uint)uVar4 & 1);
    }
    else if ("abcde"[lVar6] == 0x65) {
      if (lVar6 == 4) goto LAB_0010229e;
      break;
    }
    uVar4 = uVar3;
  } while (uVar3 != 0);
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
         ,0x36,"bsearch( \"e\", abcde, 5, 1, compare ) == &abcde[4]");
LAB_0010229e:
  pcVar2 = "bcde";
  uVar4 = 4;
  do {
    uVar3 = uVar4 >> 1;
    if ((byte)pcVar2[uVar3] < 0x61) {
      pcVar2 = pcVar2 + uVar3 + 1;
      uVar3 = uVar3 - (~(uint)uVar4 & 1);
    }
    else if (pcVar2[uVar3] == 0x61) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
             ,0x37,"bsearch( \"a\", abcde + 1, 4, 1, compare ) == NULL");
      break;
    }
    uVar4 = uVar3;
  } while (uVar3 != 0);
  lVar5 = 0;
  uVar4 = 3;
  do {
    uVar3 = uVar4 >> 1;
    lVar6 = (uVar4 & 0xfffffffffffffffe) + lVar5;
    if ((byte)"abcde"[lVar6] < 0x65) {
      lVar5 = lVar6 + 2;
      uVar3 = uVar3 - (~(uint)uVar4 & 1);
    }
    else if ("abcde"[lVar6] == 0x65) {
      if (lVar6 == 4) goto LAB_00102362;
      break;
    }
    uVar4 = uVar3;
  } while (uVar3 != 0);
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
         ,0x3b,"bsearch( \"e\", abcde, 3, 2, compare ) == &abcde[4]");
LAB_00102362:
  uVar4 = 3;
  do {
    uVar3 = uVar4 >> 1;
    if ((byte)pcVar1[uVar4 & 0xfffffffffffffffe] < 0x62) {
      pcVar1 = pcVar1 + (uVar4 & 0xfffffffffffffffe) + 2;
      uVar3 = uVar3 - (~(uint)uVar4 & 1);
    }
    else if (pcVar1[uVar4 & 0xfffffffffffffffe] == 0x62) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/bsearch.c, line %d - %s\n"
             ,0x3c,"bsearch( \"b\", abcde, 3, 2, compare ) == NULL");
      return TEST_RESULTS;
    }
    uVar4 = uVar3;
  } while (uVar3 != 0);
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( bsearch( "e", abcde, 4, 1, compare ) == NULL );
    TESTCASE( bsearch( "e", abcde, 5, 1, compare ) == &abcde[4] );
    TESTCASE( bsearch( "a", abcde + 1, 4, 1, compare ) == NULL );
    TESTCASE( bsearch( "0", abcde, 1, 1, compare ) == NULL );
    TESTCASE( bsearch( "a", abcde, 1, 1, compare ) == &abcde[0] );
    TESTCASE( bsearch( "a", abcde, 0, 1, compare ) == NULL );
    TESTCASE( bsearch( "e", abcde, 3, 2, compare ) == &abcde[4] );
    TESTCASE( bsearch( "b", abcde, 3, 2, compare ) == NULL );
    return TEST_RESULTS;
}